

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>::
TypedAttribute(TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>
               *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->_metas).interpolation.has_value_ = false;
  (this->_metas).interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  (this->_metas).elementSize.has_value_ = false;
  (this->_metas).elementSize.contained = (storage_t<unsigned_int>)0x0;
  (this->_metas).hidden.has_value_ = false;
  (this->_metas).hidden.contained = (storage_t<bool>)0x0;
  (this->_metas).comment.has_value_ = false;
  (this->_metas).weight.contained = (storage_t<double>)0x0;
  (this->_metas).connectability.has_value_ = false;
  *(undefined8 *)&(this->_metas).bindMaterialAs.contained = 0;
  *(undefined8 *)((long)&(this->_metas).bindMaterialAs.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_metas).bindMaterialAs.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).bindMaterialAs.contained + 0x18) = 0;
  p_Var1 = &(this->_metas).meta._M_t._M_impl.super__Rb_tree_header;
  (this->_metas).meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_metas).meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->_metas).comment.contained = 0;
  *(undefined8 *)((long)&(this->_metas).comment.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_metas).comment.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).comment.contained + 0x18) = 0;
  *(undefined8 *)((long)&(this->_metas).comment.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_metas).comment.contained + 0x28) = 0;
  (this->_metas).customData.has_value_ = false;
  *(undefined8 *)&(this->_metas).customData.contained = 0;
  *(undefined8 *)((long)&(this->_metas).customData.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_metas).customData.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).customData.contained + 0x18) = 0;
  *(undefined8 *)((long)&(this->_metas).customData.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_metas).customData.contained + 0x28) = 0;
  (this->_metas).weight.has_value_ = false;
  (this->_metas).outputName.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).connectability.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).connectability.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).connectability.contained = 0;
  *(undefined8 *)((long)&(this->_metas).connectability.contained + 8) = 0;
  (this->_metas).renderType.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).outputName.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).outputName.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).outputName.contained = 0;
  *(undefined8 *)((long)&(this->_metas).outputName.contained + 8) = 0;
  (this->_metas).sdrMetadata.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).renderType.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).renderType.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).renderType.contained = 0;
  *(undefined8 *)((long)&(this->_metas).renderType.contained + 8) = 0;
  (this->_metas).displayName.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).sdrMetadata.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_metas).sdrMetadata.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_metas).sdrMetadata.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).sdrMetadata.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).sdrMetadata.contained = 0;
  *(undefined8 *)((long)&(this->_metas).sdrMetadata.contained + 8) = 0;
  (this->_metas).displayGroup.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).displayName.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).displayName.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).displayName.contained = 0;
  *(undefined8 *)((long)&(this->_metas).displayName.contained + 8) = 0;
  *(undefined8 *)&(this->_metas).displayGroup.contained = 0;
  *(undefined8 *)((long)&(this->_metas).displayGroup.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_metas).displayGroup.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).displayGroup.contained + 0x18) = 0;
  (this->_metas).bindMaterialAs.has_value_ = false;
  (this->_metas).meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_metas).meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->_value_empty = false;
  (this->_metas).stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_metas).stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_metas).meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_metas).stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_blocked = false;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x30) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x38) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x18) = 0;
  *(undefined8 *)&(this->_attrib).contained = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 8) = 0;
  return;
}

Assistant:

TypedAttribute() = default;